

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_alloc.h
# Opt level: O0

void alloc_obmc_buffers(OBMCBuffer *obmc_buffer,aom_internal_error_info *error)

{
  void *pvVar1;
  aom_internal_error_info *in_RSI;
  long *in_RDI;
  size_t unaff_retaddr;
  
  pvVar1 = aom_memalign((size_t)error,unaff_retaddr);
  *in_RDI = (long)pvVar1;
  if (*in_RDI == 0) {
    aom_internal_error(in_RSI,AOM_CODEC_MEM_ERROR,"Failed to allocate obmc_buffer->wsrc");
  }
  pvVar1 = aom_memalign((size_t)error,unaff_retaddr);
  in_RDI[1] = (long)pvVar1;
  if (in_RDI[1] == 0) {
    aom_internal_error(in_RSI,AOM_CODEC_MEM_ERROR,"Failed to allocate obmc_buffer->mask");
  }
  pvVar1 = aom_memalign((size_t)error,unaff_retaddr);
  in_RDI[2] = (long)pvVar1;
  if (in_RDI[2] == 0) {
    aom_internal_error(in_RSI,AOM_CODEC_MEM_ERROR,"Failed to allocate obmc_buffer->above_pred");
  }
  pvVar1 = aom_memalign((size_t)error,unaff_retaddr);
  in_RDI[3] = (long)pvVar1;
  if (in_RDI[3] == 0) {
    aom_internal_error(in_RSI,AOM_CODEC_MEM_ERROR,"Failed to allocate obmc_buffer->left_pred");
  }
  return;
}

Assistant:

static inline void alloc_obmc_buffers(OBMCBuffer *obmc_buffer,
                                      struct aom_internal_error_info *error) {
  AOM_CHECK_MEM_ERROR(
      error, obmc_buffer->wsrc,
      (int32_t *)aom_memalign(16, MAX_SB_SQUARE * sizeof(*obmc_buffer->wsrc)));
  AOM_CHECK_MEM_ERROR(
      error, obmc_buffer->mask,
      (int32_t *)aom_memalign(16, MAX_SB_SQUARE * sizeof(*obmc_buffer->mask)));
  AOM_CHECK_MEM_ERROR(
      error, obmc_buffer->above_pred,
      (uint8_t *)aom_memalign(
          16, MAX_MB_PLANE * MAX_SB_SQUARE * sizeof(*obmc_buffer->above_pred)));
  AOM_CHECK_MEM_ERROR(
      error, obmc_buffer->left_pred,
      (uint8_t *)aom_memalign(
          16, MAX_MB_PLANE * MAX_SB_SQUARE * sizeof(*obmc_buffer->left_pred)));
}